

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O0

void __thiscall
chrono::ChFrame<double>::TransformLocalToParent
          (ChFrame<double> *this,ChFrame<double> *local,ChFrame<double> *parent)

{
  ChQuaternion<double> local_58;
  ChVector<double> local_38;
  ChFrame<double> *local_20;
  ChFrame<double> *parent_local;
  ChFrame<double> *local_local;
  ChFrame<double> *this_local;
  
  local_20 = parent;
  parent_local = local;
  local_local = this;
  TransformLocalToParent(&local_38,this,&(local->coord).pos);
  ChQuaternion<double>::operator%(&local_58,&(this->coord).rot,&(parent_local->coord).rot);
  SetCoord(parent,&local_38,&local_58);
  return;
}

Assistant:

void TransformLocalToParent(
        const ChFrame<Real>& local,  ///< frame to transform, given in local frame coordinates
        ChFrame<Real>& parent        ///< transformed frame, in parent coordinates, will be stored here
        ) const {
        parent.SetCoord(TransformLocalToParent(local.coord.pos), coord.rot % local.coord.rot);
    }